

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint64_t farmhashna::HashLen33to64(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  long in_RSI;
  char *in_RDI;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t z;
  uint64_t y;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mul;
  undefined8 in_stack_ffffffffffffff58;
  int shift;
  uint64_t in_stack_ffffffffffffff60;
  
  uVar1 = in_RSI * 2 + 0x9ae16a3b2f90404f;
  uVar2 = util::Fetch64(in_RDI);
  uVar2 = uVar2 * -0x651e95c4d06fbfb1;
  util::Fetch64(in_RDI + 8);
  uVar3 = util::Fetch64(in_RDI + in_RSI + -8);
  uVar4 = util::Fetch64(in_RDI + in_RSI + -0x10);
  uVar5 = util::Rotate64(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  shift = (int)(uVar5 >> 0x20);
  uVar6 = util::Rotate64(in_stack_ffffffffffffff60,shift);
  uVar4 = uVar5 + uVar6 + uVar4 * -0x651e95c4d06fbfb1;
  uVar5 = util::Rotate64(uVar2,shift);
  uVar3 = HashLen16(uVar4,uVar2 + uVar5 + uVar3 * uVar1,uVar1);
  uVar5 = util::Fetch64(in_RDI + 0x10);
  util::Fetch64(in_RDI + 0x18);
  uVar6 = util::Fetch64(in_RDI + in_RSI + -0x20);
  uVar7 = util::Fetch64(in_RDI + in_RSI + -0x18);
  uVar8 = util::Rotate64(uVar2,shift);
  uVar9 = util::Rotate64(uVar2,shift);
  uVar2 = util::Rotate64(uVar2,shift);
  uVar1 = HashLen16(uVar8 + uVar9 + (uVar3 + uVar7) * uVar1,
                    uVar5 * uVar1 + uVar2 + (uVar4 + uVar6) * uVar1,uVar1);
  return uVar1;
}

Assistant:

STATIC_INLINE uint64_t HashLen33to64(const char *s, size_t len) {
  uint64_t mul = k2 + len * 2;
  uint64_t a = Fetch(s) * k2;
  uint64_t b = Fetch(s + 8);
  uint64_t c = Fetch(s + len - 8) * mul;
  uint64_t d = Fetch(s + len - 16) * k2;
  uint64_t y = Rotate(a + b, 43) + Rotate(c, 30) + d;
  uint64_t z = HashLen16(y, a + Rotate(b + k2, 18) + c, mul);
  uint64_t e = Fetch(s + 16) * mul;
  uint64_t f = Fetch(s + 24);
  uint64_t g = (y + Fetch(s + len - 32)) * mul;
  uint64_t h = (z + Fetch(s + len - 24)) * mul;
  return HashLen16(Rotate(e + f, 43) + Rotate(g, 30) + h,
                   e + Rotate(f + a, 18) + g, mul);
}